

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

Group * metaf::GroupParser::reparseAlternative<1ul>
                  (string *group,ReportPart reportPart,ReportMetadata *reportMetadata,
                  size_t ignoreIndex)

{
  bool bVar1;
  ReportMetadata *in_RCX;
  ReportPart in_EDX;
  string *in_RSI;
  Group *in_RDI;
  long in_R8;
  string *unaff_retaddr;
  optional<metaf::LocationGroup> parsed;
  Group *this;
  undefined4 in_stack_fffffffffffffff0;
  
  this = in_RDI;
  if (in_R8 != 1) {
    LocationGroup::parse(in_RSI,in_EDX,in_RCX);
    bVar1 = std::optional<metaf::LocationGroup>::has_value
                      ((optional<metaf::LocationGroup> *)0x252cf8);
    if (bVar1) {
      std::optional<metaf::LocationGroup>::operator*((optional<metaf::LocationGroup> *)0x252d08);
      std::
      variant<metaf::KeywordGroup,metaf::LocationGroup,metaf::ReportTimeGroup,metaf::TrendGroup,metaf::WindGroup,metaf::VisibilityGroup,metaf::CloudGroup,metaf::WeatherGroup,metaf::TemperatureGroup,metaf::PressureGroup,metaf::RunwayStateGroup,metaf::SeaSurfaceGroup,metaf::MinMaxTemperatureGroup,metaf::PrecipitationGroup,metaf::LayerForecastGroup,metaf::PressureTendencyGroup,metaf::CloudTypesGroup,metaf::LowMidHighCloudGroup,metaf::LightningGroup,metaf::VicinityGroup,metaf::MiscGroup,metaf::UnknownGroup>
      ::variant<metaf::LocationGroup_const&,void,void,metaf::LocationGroup,void>
                (this,(LocationGroup *)in_RDI);
      return this;
    }
  }
  reparseAlternative<2ul>
            (unaff_retaddr,(ReportPart)((ulong)in_RSI >> 0x20),
             (ReportMetadata *)CONCAT44(in_EDX,in_stack_fffffffffffffff0),(size_t)in_RCX);
  return this;
}

Assistant:

static Group reparseAlternative(const std::string & group,
		ReportPart reportPart,
		const ReportMetadata & reportMetadata,
		size_t ignoreIndex)
	{
		using Alternative = std::variant_alternative_t<I, Group>;
		if constexpr (!std::is_same<Alternative, FallbackGroup>::value) {
			if (I != ignoreIndex) {
				const auto parsed = Alternative::parse(group, reportPart, reportMetadata);
				if (parsed.has_value()) return *parsed;
			}
		}
		if constexpr (I >= (std::variant_size_v<Group> - 1)) {
			return FallbackGroup();
		} else {
			return reparseAlternative<I+1>(group, reportPart, reportMetadata, ignoreIndex);
		}
	}